

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::sessionFixtureSessionCapableOfLoggingHelper::
~sessionFixtureSessionCapableOfLoggingHelper(sessionFixtureSessionCapableOfLoggingHelper *this)

{
  sessionFixture::~sessionFixture(&this->super_sessionFixture);
  operator_delete(this,0x630);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionCapableOfLogging) {
  Session* sessionObject;

  SessionID sessionIDCustom( BeginString( "FIX.4.2" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );
  TimeRange sessionTimeCustom( startTime, endTime );

  DataDictionaryProvider providerCustom;
  providerCustom.addTransportDataDictionary( sessionIDCustom.getBeginString(), "../spec/FIX42.xml" );
  Dictionary dict;
  dict.setString("ConnectionType", "initiator");
  dict.setString("FileLogPath", "log");

  SessionSettings settings;
  settings.set(sessionIDCustom, dict);
  FileLogFactory fileLogFactory(settings);

  sessionObject = new Session( *this, factory, sessionIDCustom, providerCustom,
      sessionTimeCustom, 1, &fileLogFactory);

  Log* log = object->getLog();
  CHECK(log != nullptr);

  delete sessionObject;
}